

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall
gvr::anon_unknown_3::PLYProperty::PLYProperty
          (PLYProperty *this,string *propname,ply_type type,ply_encoding encoding)

{
  PLYValue *pPVar1;
  
  this->enc = encoding;
  std::__cxx11::string::string((string *)&this->name,(string *)propname);
  this->tsize = ply_none;
  this->tvalue = type;
  pPVar1 = createValue(type,encoding);
  this->value = pPVar1;
  this->receiver = (PLYReceiver *)0x0;
  return;
}

Assistant:

PLYProperty::PLYProperty(const std::string &propname, ply_type type, ply_encoding encoding):
  enc(encoding), name(propname)
{
  tsize=ply_none;
  tvalue=type;
  value=createValue(type, encoding);
  receiver=0;
}